

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall TiXmlElement::TiXmlElement(TiXmlElement *this,TiXmlElement *copy)

{
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = &TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = TINYXML_ELEMENT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlElement_00218780;
  (this->attributeSet).sentinel.super_TiXmlBase.location.row = -1;
  (this->attributeSet).sentinel.super_TiXmlBase.location.col = -1;
  (this->attributeSet).sentinel.super_TiXmlBase.userData = (void *)0x0;
  (this->attributeSet).sentinel.document = (TiXmlDocument *)0x0;
  (this->attributeSet).sentinel.super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlAttribute_00218c00;
  (this->attributeSet).sentinel.name.rep_ = &TiXmlString::nullrep_;
  (this->attributeSet).sentinel.value.rep_ = &TiXmlString::nullrep_;
  (this->attributeSet).sentinel.prev = (TiXmlAttribute *)0x0;
  (this->attributeSet).sentinel.next = (TiXmlAttribute *)0x0;
  (this->attributeSet).sentinel.next = &(this->attributeSet).sentinel;
  (this->attributeSet).sentinel.prev = &(this->attributeSet).sentinel;
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlElement::TiXmlElement( const TiXmlElement& copy)
	: TiXmlNode( TiXmlNode::TINYXML_ELEMENT )
{
	firstChild = lastChild = 0;
	copy.CopyTo( this );	
}